

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_pcm_interleave_s24(void *dst,void **src,ma_uint64 frameCount,ma_uint32 channels)

{
  long lVar1;
  ulong uVar2;
  ma_uint64 mVar3;
  long lVar4;
  void **ppvVar5;
  ulong uVar6;
  
  for (mVar3 = 0; mVar3 != frameCount; mVar3 = mVar3 + 1) {
    lVar1 = mVar3 * 3;
    lVar4 = lVar1 * (ulong)channels;
    ppvVar5 = src;
    for (uVar2 = 0; (ulong)channels * 3 != uVar2; uVar2 = uVar2 + 3) {
      uVar6 = uVar2 & 0xffffffff;
      *(undefined1 *)((long)dst + uVar6 + lVar4) = *(undefined1 *)((long)*ppvVar5 + lVar1);
      *(undefined1 *)((long)dst + uVar6 + lVar4 + 1) = *(undefined1 *)((long)*ppvVar5 + lVar1 + 1);
      *(undefined1 *)((long)dst + uVar6 + lVar4 + 2) = *(undefined1 *)((long)*ppvVar5 + lVar1 + 2);
      ppvVar5 = ppvVar5 + 1;
    }
  }
  return;
}

Assistant:

MA_API void ma_pcm_interleave_s24(void* dst, const void** src, ma_uint64 frameCount, ma_uint32 channels)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_interleave_s24__reference(dst, src, frameCount, channels);
#else
    ma_pcm_interleave_s24__optimized(dst, src, frameCount, channels);
#endif
}